

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O1

REF_STATUS ref_part_cad_association(REF_GRID ref_grid,char *filename)

{
  REF_MPI ref_mpi;
  REF_GEOM pRVar1;
  REF_FILEPOS RVar2;
  int iVar3;
  uint uVar4;
  REF_STATUS RVar5;
  size_t sVar6;
  __off_t _Var7;
  REF_NODE ref_node;
  REF_BOOL available;
  REF_INT version;
  REF_FILEPOS next_position;
  REF_LONG ngeom;
  REF_INT dim;
  REF_FILEPOS key_pos [156];
  int local_550;
  REF_INT local_54c;
  FILE *local_548;
  REF_FILEPOS local_540;
  REF_GEOM local_538;
  REF_LONG local_530;
  REF_NODE local_528;
  undefined1 local_51c [4];
  REF_FILEPOS local_518 [157];
  
  ref_mpi = ref_grid->mpi;
  ref_node = ref_grid->node;
  pRVar1 = ref_grid->geom;
  local_540 = -1;
  sVar6 = strlen(filename);
  iVar3 = strcmp(filename + (sVar6 - 6),".meshb");
  if (iVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x3b3,
           "ref_part_cad_association",3,"expected .meshb extension");
    return 3;
  }
  local_538 = pRVar1;
  if (ref_mpi->id == 0) {
    uVar4 = ref_import_meshb_header(filename,&local_54c,local_518);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x3b7,
             "ref_part_cad_association",(ulong)uVar4,"header");
      return uVar4;
    }
    local_548 = fopen(filename,"r");
    if (local_548 == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x3bc,
             "ref_part_cad_association","unable to open file");
      return 2;
    }
    uVar4 = ref_import_meshb_jump((FILE *)local_548,local_54c,local_518,3,&local_550,&local_540);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x3bf,
             "ref_part_cad_association",(ulong)uVar4,"jump");
      return uVar4;
    }
    if (local_550 == 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x3c0,
             "ref_part_cad_association","meshb missing dimension");
      return 1;
    }
    sVar6 = fread(local_51c,4,1,local_548);
    if (sVar6 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x3c1,
             "ref_part_cad_association","dim",1,sVar6);
      return 1;
    }
  }
  else {
    local_548 = (FILE *)0x0;
  }
  uVar4 = ref_mpi_bcast(ref_mpi,&local_54c,1,1);
  if (uVar4 == 0) {
    uVar4 = ref_geom_initialize(local_538);
    if (uVar4 == 0) {
      iVar3 = 0;
      local_528 = ref_node;
      do {
        if (ref_grid->mpi->id == 0) {
          uVar4 = ref_import_meshb_jump
                            ((FILE *)local_548,local_54c,local_518,iVar3 + 0x28,&local_550,
                             &local_540);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x3cd,"ref_part_cad_association",(ulong)uVar4,"jump");
            return uVar4;
          }
          if ((local_550 != 0) &&
             (RVar5 = ref_part_meshb_long((FILE *)local_548,local_54c,&local_530), RVar5 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x3cf,"ref_part_cad_association",1,"ngeom");
            return 1;
          }
        }
        uVar4 = ref_mpi_bcast(ref_mpi,&local_550,1,1);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x3d3,"ref_part_cad_association",(ulong)uVar4,"bcast");
          return uVar4;
        }
        if (local_550 != 0) {
          uVar4 = ref_mpi_bcast(ref_mpi,&local_530,1,2);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x3d5,"ref_part_cad_association",(ulong)uVar4,"bcast");
            return uVar4;
          }
          uVar4 = ref_part_meshb_geom_bcast
                            (local_538,local_530,iVar3,ref_node,local_54c,(FILE *)local_548);
          RVar2 = local_540;
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x3d8,"ref_part_cad_association",(ulong)uVar4,"part geom bcast");
            return uVar4;
          }
          if ((ref_grid->mpi->id == 0) &&
             (_Var7 = ftello(local_548), ref_node = local_528, RVar2 != _Var7)) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x3da,"ref_part_cad_association","end location",RVar2,_Var7);
            return 1;
          }
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 != 3);
      uVar4 = 0;
      if (ref_grid->mpi->id == 0) {
        fclose(local_548);
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x3c6,
             "ref_part_cad_association",(ulong)uVar4,"clear out previous assoc");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x3c4,
           "ref_part_cad_association",(ulong)uVar4,"bcast");
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_part_cad_association(REF_GRID ref_grid,
                                            const char *filename) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  FILE *file;
  REF_INT version, dim;
  REF_BOOL available;
  REF_FILEPOS next_position = REF_EMPTY;
  REF_FILEPOS key_pos[REF_IMPORT_MESHB_LAST_KEYWORD];
  REF_INT type, geom_keyword;
  REF_LONG ngeom;
  REF_BOOL verbose = REF_FALSE;
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (strcmp(&filename[end_of_string - 6], ".meshb") != 0)
    RSS(REF_INVALID, "expected .meshb extension");

  file = NULL;
  if (ref_mpi_once(ref_mpi)) {
    RSS(ref_import_meshb_header(filename, &version, key_pos), "header");
    if (verbose) printf("meshb version %d\n", version);
    if (verbose) printf("open %s\n", filename);
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    RSS(ref_import_meshb_jump(file, version, key_pos, 3, &available,
                              &next_position),
        "jump");
    RAS(available, "meshb missing dimension");
    REIS(1, fread((unsigned char *)&dim, 4, 1, file), "dim");
    if (verbose) printf("meshb dim %d\n", dim);
  }
  RSS(ref_mpi_bcast(ref_mpi, &version, 1, REF_INT_TYPE), "bcast");

  RSS(ref_geom_initialize(ref_geom), "clear out previous assoc");

  each_ref_type(ref_geom, type) {
    if (ref_grid_once(ref_grid)) {
      geom_keyword = 40 + type;
      RSS(ref_import_meshb_jump(file, version, key_pos, geom_keyword,
                                &available, &next_position),
          "jump");
      if (available) {
        RSS(ref_part_meshb_long(file, version, &ngeom), "ngeom");
        if (verbose) printf("type %d ngeom %ld\n", type, ngeom);
      }
    }
    RSS(ref_mpi_bcast(ref_mpi, &available, 1, REF_INT_TYPE), "bcast");
    if (available) {
      RSS(ref_mpi_bcast(ref_mpi, &ngeom, 1, REF_LONG_TYPE), "bcast");
      RSS(ref_part_meshb_geom_bcast(ref_geom, ngeom, type, ref_node, version,
                                    file),
          "part geom bcast");
      if (ref_grid_once(ref_grid))
        REIS(next_position, ftello(file), "end location");
    }
  }

  if (ref_grid_once(ref_grid)) {
    fclose(file);
  }

  return REF_SUCCESS;
}